

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O0

VariableType *
rsg::computeRandomType(VariableType *__return_storage_ptr__,GeneratorState *state,int maxScalars)

{
  int baseType_00;
  int iVar1;
  Random *pRVar2;
  Exception *this;
  allocator<char> local_49;
  string local_48;
  undefined4 local_28;
  undefined4 local_24;
  int maxVecLength;
  int minVecLength;
  Type baseType;
  int maxScalars_local;
  GeneratorState *state_local;
  
  maxVecLength = 8;
  minVecLength = maxScalars;
  _baseType = state;
  state_local = (GeneratorState *)__return_storage_ptr__;
  pRVar2 = GeneratorState::getRandom(state);
  de::Random::choose<rsg::VariableType::Type_const*,rsg::VariableType::Type*>
            (pRVar2,computeRandomType::baseTypes,(Type *)"Invalid type",(Type *)&maxVecLength,1);
  baseType_00 = maxVecLength;
  if (maxVecLength - 1U < 3) {
    local_24 = 1;
    local_28 = 4;
    pRVar2 = GeneratorState::getRandom(_baseType);
    iVar1 = de::min<int>(minVecLength,4);
    iVar1 = de::Random::getInt(pRVar2,1,iVar1);
    VariableType::VariableType(__return_storage_ptr__,baseType_00,iVar1);
    return __return_storage_ptr__;
  }
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"computeRandomType(): Unsupported type",&local_49);
  Exception::Exception(this,&local_48);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

VariableType computeRandomType (GeneratorState& state, int maxScalars)
{
	DE_ASSERT(maxScalars >= 1);

	static const VariableType::Type baseTypes[] =
	{
		VariableType::TYPE_BOOL,
		VariableType::TYPE_INT,
		VariableType::TYPE_FLOAT
		// \todo [pyry] Other types
	};

	VariableType::Type baseType = VariableType::TYPE_LAST;
	state.getRandom().choose(baseTypes, baseTypes + DE_LENGTH_OF_ARRAY(baseTypes), &baseType, 1);

	switch (baseType)
	{
		case VariableType::TYPE_BOOL:
		case VariableType::TYPE_INT:
		case VariableType::TYPE_FLOAT:
		{
			const int minVecLength = 1;
			const int maxVecLength = 4;
			return VariableType(baseType, state.getRandom().getInt(minVecLength, de::min(maxScalars, maxVecLength)));
		}

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("computeRandomType(): Unsupported type");
	}
}